

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fShaderMatrixTests.cpp
# Opt level: O3

void deqp::gles2::Functional::MatrixCaseUtils::writeVectorConstructor<2>
               (ostream *str,Vector<float,_2> *v)

{
  bool bVar1;
  bool bVar2;
  ostream *poVar3;
  float *pfVar4;
  int precision;
  int extraout_EDX;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  undefined8 extraout_RDX_01;
  undefined8 uVar5;
  string local_50;
  
  std::__ostream_insert<char,std::char_traits<char>>(str,"vec",3);
  poVar3 = (ostream *)std::ostream::operator<<(str,2);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,"(",1);
  uVar5 = extraout_RDX;
  bVar2 = true;
  do {
    bVar1 = bVar2;
    precision = (int)uVar5;
    pfVar4 = v->m_data;
    if (!bVar1) {
      std::__ostream_insert<char,std::char_traits<char>>(str,", ",2);
      pfVar4 = v->m_data + 1;
      precision = extraout_EDX;
    }
    de::floatToString_abi_cxx11_(&local_50,(de *)0x1,*pfVar4,precision);
    std::__ostream_insert<char,std::char_traits<char>>
              (str,local_50._M_dataplus._M_p,local_50._M_string_length);
    uVar5 = extraout_RDX_00;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
      uVar5 = extraout_RDX_01;
    }
    bVar2 = false;
  } while (bVar1);
  std::__ostream_insert<char,std::char_traits<char>>(str,")",1);
  return;
}

Assistant:

void writeVectorConstructor (std::ostream& str, const tcu::Vector<float, Size>& v)
{
	str << "vec" << Size << "(";
	for (int ndx = 0; ndx < Size; ndx++)
	{
		if (ndx != 0)
			str << ", ";
		str << de::floatToString(v[ndx], 1);
	}
	str << ")";
}